

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void __thiscall aim_t::EnterLinePortal(aim_t *this,line_t *li,double frac)

{
  double dVar1;
  FLinePortal *pFVar2;
  DVector2 local_168;
  aim_t local_150;
  
  Clone(this);
  pFVar2 = (FLinePortal *)0x0;
  if (li->portalindex < linePortals.Count) {
    pFVar2 = linePortals.Array + li->portalindex;
  }
  if ((pFVar2->mType == '\x03') || ((this->flags & 0x20) == 0)) {
    local_150.toppitch.Degrees = (this->toppitch).Degrees;
    local_150.bottompitch.Degrees = (this->bottompitch).Degrees;
    local_150.aimdir = this->aimdir;
    local_150.unlinked = pFVar2->mType != '\x03';
    local_150.startpos.X = (this->startpos).X;
    local_150.startpos.Y = (this->startpos).Y;
    local_150.aimtrace.Y = (this->aimtrace).Y;
    local_150.startpos.Z = (this->startpos).Z;
    local_150.aimtrace.X = (this->aimtrace).X;
    P_TranslatePortalXY(li,&local_150.startpos.X,&local_150.startpos.Y);
    P_TranslatePortalZ(li,&local_150.startpos.Z);
    P_TranslatePortalVXVY(li,&local_150.aimtrace.X,&local_150.aimtrace.Y);
    local_150.startfrac = 1.0 / this->attackrange + frac;
    dVar1 = local_150.startfrac * local_150.aimtrace.Y + local_150.startpos.Y;
    local_168.Y._0_4_ = SUB84(dVar1,0);
    local_168.X = local_150.startfrac * local_150.aimtrace.X + local_150.startpos.X;
    local_168.Y._4_4_ = (int)((ulong)dVar1 >> 0x20);
    local_150.lastsector = P_PointInSector(&local_168);
    P_TranslatePortalZ(li,&this->limitz);
    if (aimdebug.Value == true) {
      Printf("-----Entering line portal from sector %d to sector %d\n",
             (ulong)(uint)this->lastsector->sectornum,(ulong)(uint)(local_150.lastsector)->sectornum
            );
    }
    AimTraverse(&local_150);
    SetResult(this,&this->linetarget,&local_150.linetarget);
    SetResult(this,&this->thing_friend,&local_150.thing_friend);
    SetResult(this,&this->thing_other,&local_150.thing_other);
  }
  return;
}

Assistant:

void EnterLinePortal(line_t *li, double frac)
	{
		aim_t newtrace = Clone();

		FLinePortal *port = li->getPortal();
		if (port->mType != PORTT_LINKED && (flags & ALF_PORTALRESTRICT)) return;

		newtrace.toppitch = toppitch;
		newtrace.bottompitch = bottompitch;
		newtrace.aimdir = aimdir;
		newtrace.unlinked = (port->mType != PORTT_LINKED);
		newtrace.startpos = startpos;
		newtrace.aimtrace = aimtrace;
		P_TranslatePortalXY(li, newtrace.startpos.X, newtrace.startpos.Y);
		P_TranslatePortalZ(li, newtrace.startpos.Z);
		P_TranslatePortalVXVY(li, newtrace.aimtrace.X, newtrace.aimtrace.Y);

		newtrace.startfrac = frac + 1 / attackrange;	// this is to skip the transition line to the portal which would produce a bogus opening

		DVector2 pos = newtrace.startpos + newtrace.aimtrace * newtrace.startfrac;

		newtrace.lastsector = P_PointInSector(pos);
		P_TranslatePortalZ(li, limitz);
		if (aimdebug)
			Printf("-----Entering line portal from sector %d to sector %d\n", lastsector->sectornum, newtrace.lastsector->sectornum);
		newtrace.AimTraverse();
		SetResult(linetarget, newtrace.linetarget);
		SetResult(thing_friend, newtrace.thing_friend);
		SetResult(thing_other, newtrace.thing_other);
	}